

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int ecdh_sha2_nistp(LIBSSH2_SESSION *session,libssh2_curve_type type,uchar *data,size_t data_len,
                   uchar *public_key,size_t public_key_len,EVP_PKEY *private_key,
                   kmdhgGPshakex_state_t *exchange_state)

{
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var1;
  LIBSSH2_CRYPT_METHOD *pLVar2;
  _LIBSSH2_MAC_METHOD *p_Var3;
  LIBSSH2_COMP_METHOD *pLVar4;
  _func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *p_Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  BIGNUM *pBVar14;
  uchar *puVar15;
  uchar *puVar16;
  size_t sVar17;
  LIBSSH2_HOSTKEY_METHOD *pLVar18;
  char *pcVar19;
  ulong uVar20;
  uchar *puVar21;
  long lVar22;
  size_t sVar23;
  uint uVar24;
  size_t sVar25;
  uint32_t value;
  EVP_MD_CTX *ctx;
  libssh2_curve_type local_8c;
  uchar *server_public_key;
  uint local_7c;
  uchar *local_78;
  size_t server_public_key_len;
  void **local_68;
  EVP_MD_CTX *hash;
  uchar *local_58;
  size_t local_50;
  size_t *local_48;
  uchar **local_40;
  uint local_34;
  
  if (data_len < 5) {
    iVar7 = _libssh2_error(session,-10,"Host key data is too short");
    return iVar7;
  }
  local_8c = type;
  if (exchange_state->state == libssh2_NB_state_idle) {
    pBVar14 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar14;
    exchange_state->state = libssh2_NB_state_created;
  }
  iVar7 = 0;
  if (exchange_state->state == libssh2_NB_state_created) {
    local_58 = data + 1;
    hash = (EVP_MD_CTX *)data;
    local_50 = data_len;
    iVar7 = _libssh2_copy_string
                      (session,(string_buf *)&hash,&session->server_hostkey,&server_public_key_len);
    if (iVar7 == 0) {
      session->server_hostkey_len = (uint32_t)server_public_key_len;
      iVar7 = _libssh2_md5_init((EVP_MD_CTX **)&server_public_key);
      if ((iVar7 == 0) ||
         (iVar7 = _libssh2_md5_update((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                                      (ulong)session->server_hostkey_len), iVar7 == 0)) {
LAB_0010ae7f:
        iVar8 = 0;
      }
      else {
        iVar7 = _libssh2_md5_final((EVP_MD_CTX **)&server_public_key,session->server_hostkey_md5);
        iVar8 = 1;
        if (iVar7 == 0) goto LAB_0010ae7f;
      }
      session->server_hostkey_md5_valid = iVar8;
      iVar7 = _libssh2_sha1_init((EVP_MD_CTX **)&server_public_key);
      if ((iVar7 == 0) ||
         (iVar7 = _libssh2_sha1_update
                            ((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                             (ulong)session->server_hostkey_len), iVar7 == 0)) {
LAB_0010aeca:
        iVar8 = 0;
      }
      else {
        iVar7 = _libssh2_sha1_final((EVP_MD_CTX **)&server_public_key,session->server_hostkey_sha1);
        iVar8 = 1;
        if (iVar7 == 0) goto LAB_0010aeca;
      }
      session->server_hostkey_sha1_valid = iVar8;
      iVar7 = _libssh2_sha256_init((EVP_MD_CTX **)&server_public_key);
      if ((iVar7 == 0) ||
         (iVar7 = _libssh2_sha256_update
                            ((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                             (ulong)session->server_hostkey_len), iVar7 == 0)) {
LAB_0010af15:
        iVar8 = 0;
      }
      else {
        iVar7 = _libssh2_sha256_final
                          ((EVP_MD_CTX **)&server_public_key,session->server_hostkey_sha256);
        iVar8 = 1;
        if (iVar7 == 0) goto LAB_0010af15;
      }
      session->server_hostkey_sha256_valid = iVar8;
      iVar7 = (*session->hostkey->init)
                        (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                         &session->server_hostkey_abstract);
      if (iVar7 != 0) {
        pcVar19 = "Unable to initialize hostkey importer ECDH";
LAB_0010af4c:
        iVar7 = -10;
        goto LAB_0010af81;
      }
      iVar7 = _libssh2_get_string((string_buf *)&hash,&server_public_key,&server_public_key_len);
      if (iVar7 != 0) {
        pcVar19 = "Unexpected key length ECDH";
        iVar7 = -0xe;
        goto LAB_0010af81;
      }
      local_68 = &session->server_hostkey_abstract;
      iVar7 = _libssh2_get_string((string_buf *)&hash,&exchange_state->h_sig,
                                  &exchange_state->h_sig_len);
      if (iVar7 != 0) {
        pcVar19 = "Unexpected ECDH server sig length";
        goto LAB_0010af4c;
      }
      local_48 = &exchange_state->h_sig_len;
      local_40 = &exchange_state->h_sig;
      iVar7 = _libssh2_ecdh_gen_k(&exchange_state->k,private_key,
                                  (uchar *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                                  CONCAT44(server_public_key_len._4_4_,
                                           (uint32_t)server_public_key_len));
      if (iVar7 == 0) {
        iVar8 = BN_num_bits((BIGNUM *)exchange_state->k);
        iVar7 = iVar8 + 0xe;
        if (-1 < iVar8 + 7) {
          iVar7 = iVar8 + 7;
        }
        exchange_state->k_value_len = (long)((iVar7 >> 3) + 5);
        uVar9 = BN_num_bits((BIGNUM *)exchange_state->k);
        if ((uVar9 & 7) != 0) {
          exchange_state->k_value_len = exchange_state->k_value_len - 1;
        }
        puVar15 = (uchar *)(*session->alloc)(exchange_state->k_value_len,&session->abstract);
        exchange_state->k_value = puVar15;
        if (puVar15 == (uchar *)0x0) {
          pcVar19 = "Unable to allocate buffer for ECDH K";
          iVar7 = -6;
        }
        else {
          _libssh2_htonu32(puVar15,(int)exchange_state->k_value_len - 4);
          uVar9 = BN_num_bits((BIGNUM *)exchange_state->k);
          lVar22 = 4;
          if ((uVar9 & 7) == 0) {
            exchange_state->k_value[4] = '\0';
            lVar22 = 5;
          }
          BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + lVar22);
          value = (uint32_t)public_key_len;
          if (local_8c == LIBSSH2_EC_CURVE_NISTP521) {
            iVar8 = _libssh2_sha512_init(&ctx);
            iVar7 = -1;
            if (iVar8 != 0) {
              exchange_state->exchange_hash = &ctx;
              puVar16 = (session->local).banner;
              puVar15 = exchange_state->h_sig_comp;
              if (puVar16 == (uchar *)0x0) {
                _libssh2_htonu32(puVar15,0x1a);
                uVar9 = _libssh2_sha512_update(&ctx,puVar15,4);
                pcVar19 = "SSH-2.0-libssh2_1.11.1_DEV";
                sVar25 = 0x1a;
              }
              else {
                sVar17 = strlen((char *)puVar16);
                _libssh2_htonu32(puVar15,(int)sVar17 - 2);
                uVar9 = _libssh2_sha512_update(&ctx,puVar15,4);
                pcVar19 = (char *)(session->local).banner;
                sVar17 = strlen(pcVar19);
                sVar25 = sVar17 - 2;
              }
              uVar11 = _libssh2_sha512_update(&ctx,pcVar19,sVar25);
              local_78._0_4_ = uVar11 & uVar9 & 1;
              sVar17 = strlen((char *)(session->remote).banner);
              _libssh2_htonu32(puVar15,(uint32_t)sVar17);
              uVar9 = _libssh2_sha512_update(&ctx,puVar15,4);
              puVar16 = (session->remote).banner;
              sVar17 = strlen((char *)puVar16);
              uVar11 = _libssh2_sha512_update(&ctx,puVar16,sVar17);
              _libssh2_htonu32(puVar15,(uint32_t)(session->local).kexinit_len);
              uVar12 = _libssh2_sha512_update(&ctx,puVar15,4);
              uVar13 = _libssh2_sha512_update
                                 (&ctx,(session->local).kexinit,(session->local).kexinit_len);
              local_78 = (uchar *)CONCAT44(local_78._4_4_,
                                           uVar13 & uVar12 & uVar11 & uVar9 & (uint)local_78);
              _libssh2_htonu32(puVar15,(uint32_t)(session->remote).kexinit_len);
              uVar9 = _libssh2_sha512_update(&ctx,puVar15,4);
              uVar11 = _libssh2_sha512_update
                                 (&ctx,(session->remote).kexinit,(session->remote).kexinit_len);
              _libssh2_htonu32(puVar15,session->server_hostkey_len);
              uVar12 = _libssh2_sha512_update(&ctx,puVar15,4);
              local_7c = _libssh2_sha512_update
                                   (&ctx,session->server_hostkey,(ulong)session->server_hostkey_len)
              ;
              local_7c = local_7c & uVar12 & uVar11 & uVar9;
              _libssh2_htonu32(puVar15,value);
              uVar9 = _libssh2_sha512_update(&ctx,puVar15,4);
              uVar24 = uVar9 & local_7c & (uint)local_78;
              uVar9 = _libssh2_sha512_update(&ctx,public_key,public_key_len);
              _libssh2_htonu32(puVar15,(uint32_t)server_public_key_len);
              uVar11 = _libssh2_sha512_update(&ctx,puVar15,4);
              uVar12 = _libssh2_sha512_update
                                 (&ctx,(void *)CONCAT44(server_public_key._4_4_,
                                                        (int)server_public_key),
                                  CONCAT44(server_public_key_len._4_4_,
                                           (uint32_t)server_public_key_len));
              uVar13 = _libssh2_sha512_update
                                 (&ctx,exchange_state->k_value,exchange_state->k_value_len);
              if ((uVar12 & uVar11 & uVar9 & uVar24 & uVar13) == 0) {
LAB_0010d26d:
                iVar7 = -1;
              }
              else {
                iVar8 = _libssh2_sha512_final(&ctx,puVar15);
                iVar7 = -1;
                if (iVar8 != 0) {
                  pLVar18 = session->hostkey;
                  puVar15 = *local_40;
                  sVar25 = *local_48;
                  sVar23 = 0x40;
LAB_0010d015:
                  puVar16 = exchange_state->h_sig_comp;
LAB_0010d25d:
                  iVar7 = (*pLVar18->sig_verify)(session,puVar15,sVar25,puVar16,sVar23,local_68);
                  iVar7 = -(uint)(iVar7 != 0);
                }
              }
            }
          }
          else if (local_8c == LIBSSH2_EC_CURVE_NISTP384) {
            iVar8 = _libssh2_sha384_init(&ctx);
            iVar7 = -1;
            if (iVar8 != 0) {
              exchange_state->exchange_hash = &ctx;
              puVar16 = (session->local).banner;
              puVar15 = exchange_state->h_sig_comp;
              if (puVar16 == (uchar *)0x0) {
                _libssh2_htonu32(puVar15,0x1a);
                uVar9 = _libssh2_sha384_update(&ctx,puVar15,4);
                pcVar19 = "SSH-2.0-libssh2_1.11.1_DEV";
                sVar25 = 0x1a;
              }
              else {
                sVar17 = strlen((char *)puVar16);
                _libssh2_htonu32(puVar15,(int)sVar17 - 2);
                uVar9 = _libssh2_sha384_update(&ctx,puVar15,4);
                pcVar19 = (char *)(session->local).banner;
                sVar17 = strlen(pcVar19);
                sVar25 = sVar17 - 2;
              }
              uVar11 = _libssh2_sha384_update(&ctx,pcVar19,sVar25);
              local_78._0_4_ = uVar11 & uVar9 & 1;
              sVar17 = strlen((char *)(session->remote).banner);
              _libssh2_htonu32(puVar15,(uint32_t)sVar17);
              uVar9 = _libssh2_sha384_update(&ctx,puVar15,4);
              puVar16 = (session->remote).banner;
              sVar17 = strlen((char *)puVar16);
              uVar11 = _libssh2_sha384_update(&ctx,puVar16,sVar17);
              _libssh2_htonu32(puVar15,(uint32_t)(session->local).kexinit_len);
              uVar12 = _libssh2_sha384_update(&ctx,puVar15,4);
              uVar13 = _libssh2_sha384_update
                                 (&ctx,(session->local).kexinit,(session->local).kexinit_len);
              local_78 = (uchar *)CONCAT44(local_78._4_4_,
                                           uVar13 & uVar12 & uVar11 & uVar9 & (uint)local_78);
              _libssh2_htonu32(puVar15,(uint32_t)(session->remote).kexinit_len);
              uVar9 = _libssh2_sha384_update(&ctx,puVar15,4);
              uVar11 = _libssh2_sha384_update
                                 (&ctx,(session->remote).kexinit,(session->remote).kexinit_len);
              _libssh2_htonu32(puVar15,session->server_hostkey_len);
              uVar12 = _libssh2_sha384_update(&ctx,puVar15,4);
              local_7c = _libssh2_sha384_update
                                   (&ctx,session->server_hostkey,(ulong)session->server_hostkey_len)
              ;
              local_7c = local_7c & uVar12 & uVar11 & uVar9;
              _libssh2_htonu32(puVar15,value);
              uVar9 = _libssh2_sha384_update(&ctx,puVar15,4);
              uVar24 = uVar9 & local_7c & (uint)local_78;
              uVar9 = _libssh2_sha384_update(&ctx,public_key,public_key_len);
              _libssh2_htonu32(puVar15,(uint32_t)server_public_key_len);
              uVar11 = _libssh2_sha384_update(&ctx,puVar15,4);
              uVar12 = _libssh2_sha384_update
                                 (&ctx,(void *)CONCAT44(server_public_key._4_4_,
                                                        (int)server_public_key),
                                  CONCAT44(server_public_key_len._4_4_,
                                           (uint32_t)server_public_key_len));
              uVar13 = _libssh2_sha384_update
                                 (&ctx,exchange_state->k_value,exchange_state->k_value_len);
              if ((uVar12 & uVar11 & uVar9 & uVar24 & uVar13) == 0) goto LAB_0010d26d;
              iVar8 = _libssh2_sha384_final(&ctx,puVar15);
              iVar7 = -1;
              if (iVar8 != 0) {
                pLVar18 = session->hostkey;
                puVar15 = *local_40;
                sVar25 = *local_48;
                sVar23 = 0x30;
                goto LAB_0010d015;
              }
            }
          }
          else {
            iVar7 = 0;
            if (local_8c == LIBSSH2_EC_CURVE_NISTP256) {
              iVar8 = _libssh2_sha256_init(&ctx);
              iVar7 = -1;
              if (iVar8 != 0) {
                exchange_state->exchange_hash = &ctx;
                puVar15 = (session->local).banner;
                puVar16 = exchange_state->h_sig_comp;
                local_78 = puVar16;
                if (puVar15 == (uchar *)0x0) {
                  _libssh2_htonu32(puVar16,0x1a);
                  uVar9 = _libssh2_sha256_update(&ctx,puVar16,4);
                  pcVar19 = "SSH-2.0-libssh2_1.11.1_DEV";
                  sVar25 = 0x1a;
                }
                else {
                  sVar17 = strlen((char *)puVar15);
                  puVar15 = local_78;
                  _libssh2_htonu32(local_78,(int)sVar17 - 2);
                  uVar9 = _libssh2_sha256_update(&ctx,puVar15,4);
                  pcVar19 = (char *)(session->local).banner;
                  sVar17 = strlen(pcVar19);
                  sVar25 = sVar17 - 2;
                }
                uVar11 = _libssh2_sha256_update(&ctx,pcVar19,sVar25);
                local_7c = uVar11 & uVar9 & 1;
                sVar17 = strlen((char *)(session->remote).banner);
                puVar16 = local_78;
                _libssh2_htonu32(local_78,(uint32_t)sVar17);
                uVar9 = _libssh2_sha256_update(&ctx,puVar16,4);
                puVar15 = (session->remote).banner;
                sVar17 = strlen((char *)puVar15);
                uVar11 = _libssh2_sha256_update(&ctx,puVar15,sVar17);
                _libssh2_htonu32(puVar16,(uint32_t)(session->local).kexinit_len);
                uVar12 = _libssh2_sha256_update(&ctx,puVar16,4);
                uVar13 = _libssh2_sha256_update
                                   (&ctx,(session->local).kexinit,(session->local).kexinit_len);
                local_7c = uVar13 & uVar12 & uVar11 & uVar9 & local_7c;
                _libssh2_htonu32(puVar16,(uint32_t)(session->remote).kexinit_len);
                uVar9 = _libssh2_sha256_update(&ctx,puVar16,4);
                uVar11 = _libssh2_sha256_update
                                   (&ctx,(session->remote).kexinit,(session->remote).kexinit_len);
                _libssh2_htonu32(puVar16,session->server_hostkey_len);
                uVar12 = _libssh2_sha256_update(&ctx,puVar16,4);
                local_34 = _libssh2_sha256_update
                                     (&ctx,session->server_hostkey,
                                      (ulong)session->server_hostkey_len);
                local_34 = local_34 & uVar12 & uVar11 & uVar9;
                _libssh2_htonu32(puVar16,value);
                uVar9 = _libssh2_sha256_update(&ctx,puVar16,4);
                uVar24 = uVar9 & local_34 & local_7c;
                uVar9 = _libssh2_sha256_update(&ctx,public_key,public_key_len);
                _libssh2_htonu32(puVar16,(uint32_t)server_public_key_len);
                uVar11 = _libssh2_sha256_update(&ctx,puVar16,4);
                uVar12 = _libssh2_sha256_update
                                   (&ctx,(void *)CONCAT44(server_public_key._4_4_,
                                                          (int)server_public_key),
                                    CONCAT44(server_public_key_len._4_4_,
                                             (uint32_t)server_public_key_len));
                uVar13 = _libssh2_sha256_update
                                   (&ctx,exchange_state->k_value,exchange_state->k_value_len);
                if ((uVar12 & uVar11 & uVar9 & uVar24 & uVar13) == 0) goto LAB_0010d26d;
                iVar8 = _libssh2_sha256_final(&ctx,local_78);
                iVar7 = -1;
                if (iVar8 != 0) {
                  pLVar18 = session->hostkey;
                  puVar15 = *local_40;
                  sVar25 = *local_48;
                  sVar23 = 0x20;
                  puVar16 = local_78;
                  goto LAB_0010d25d;
                }
              }
            }
          }
          if (iVar7 == 0) {
            exchange_state->c = '\x15';
            exchange_state->state = libssh2_NB_state_sent;
            bVar6 = true;
            iVar7 = 0;
            goto LAB_0010af8d;
          }
          pcVar19 = "Unable to verify hostkey signature ECDH";
          iVar7 = -0xb;
        }
        iVar7 = _libssh2_error(session,iVar7,pcVar19);
        bVar6 = false;
      }
      else {
        iVar7 = _libssh2_error(session,-5,"Unable to create ECDH shared secret");
        bVar6 = false;
      }
    }
    else {
      pcVar19 = "Unable to allocate memory for a copy of the host ECDH key";
      iVar7 = -6;
LAB_0010af81:
      iVar7 = _libssh2_error(session,iVar7,pcVar19);
      bVar6 = false;
    }
LAB_0010af8d:
    iVar8 = iVar7;
    if (!bVar6) goto LAB_0010b067;
  }
  if (exchange_state->state == libssh2_NB_state_sent) {
    iVar8 = _libssh2_transport_send(session,&exchange_state->c,1,(uchar *)0x0,0);
    if (iVar8 == -0x25) {
      return -0x25;
    }
    if (iVar8 == 0) {
      exchange_state->state = libssh2_NB_state_sent2;
      goto LAB_0010afd3;
    }
    pcVar19 = "Unable to send NEWKEYS message ECDH";
LAB_0010b054:
    iVar8 = _libssh2_error(session,iVar8,pcVar19);
    goto LAB_0010b067;
  }
LAB_0010afd3:
  iVar8 = iVar7;
  if (exchange_state->state != libssh2_NB_state_sent2) goto LAB_0010b067;
  iVar8 = _libssh2_packet_require
                    (session,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,0,(uchar *)0x0,0,
                     &exchange_state->req_state);
  if (iVar8 == -0x25) {
    return -0x25;
  }
  if (iVar8 != 0) {
    pcVar19 = "Timed out waiting for NEWKEYS ECDH";
    goto LAB_0010b054;
  }
  *(byte *)&session->state = (byte)session->state | 4;
  (*session->free)(exchange_state->tmp,&session->abstract);
  if (session->session_id == (uchar *)0x0) {
    if (local_8c == LIBSSH2_EC_CURVE_NISTP256) {
      sVar25 = 0x20;
LAB_0010b181:
      puVar15 = (uchar *)(*session->alloc)(sVar25,&session->abstract);
      session->session_id = puVar15;
      if (puVar15 == (uchar *)0x0) {
        pcVar19 = "Unable to allocate buffer for SHA digest";
        iVar7 = -6;
        goto LAB_0010b1d5;
      }
      memcpy(puVar15,exchange_state->h_sig_comp,sVar25);
      session->session_id_len = (uint32_t)sVar25;
      bVar6 = true;
    }
    else {
      if (local_8c == LIBSSH2_EC_CURVE_NISTP521) {
        sVar25 = 0x40;
        goto LAB_0010b181;
      }
      if (local_8c == LIBSSH2_EC_CURVE_NISTP384) {
        sVar25 = 0x30;
        goto LAB_0010b181;
      }
      pcVar19 = "Unknown SHA digest for EC curve";
      iVar7 = -5;
LAB_0010b1d5:
      iVar7 = _libssh2_error(session,iVar7,pcVar19);
      bVar6 = false;
    }
    iVar8 = iVar7;
    if (!bVar6) goto LAB_0010b067;
  }
  p_Var1 = ((session->local).crypt)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->local).crypt_abstract);
  }
  pLVar2 = (session->local).crypt;
  if (pLVar2->init !=
      (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
       *)0x0) {
    local_68 = (void **)CONCAT44(local_68._4_4_,iVar7);
    server_public_key._0_4_ = 0;
    server_public_key_len._0_4_ = 0;
    if (local_8c == LIBSSH2_EC_CURVE_NISTP256) {
      puVar15 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x20,&session->abstract);
      if (puVar15 == (uchar *)0x0) {
LAB_0010b555:
        puVar15 = (uchar *)0x0;
      }
      else if (((session->local).crypt)->iv_len != 0) {
        sVar25 = 0;
        do {
          iVar7 = _libssh2_sha256_init(&hash);
          if (((iVar7 == 0) ||
              (iVar7 = _libssh2_sha256_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar7 == 0)) ||
             (iVar7 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar7 == 0))
          goto LAB_0010b54c;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar7 = _libssh2_sha256_update(&hash,"A",1);
            if (iVar7 == 0) goto LAB_0010b54c;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar7 = _libssh2_sha256_update(&hash,puVar16,uVar20);
          if ((iVar7 == 0) || (iVar7 = _libssh2_sha256_final(&hash,puVar15 + sVar25), iVar7 == 0))
          goto LAB_0010b54c;
          sVar25 = sVar25 + 0x20;
        } while (sVar25 < (ulong)(long)((session->local).crypt)->iv_len);
      }
    }
    else if (local_8c == LIBSSH2_EC_CURVE_NISTP521) {
      puVar15 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x40,&session->abstract);
      if (puVar15 == (uchar *)0x0) goto LAB_0010b555;
      if (((session->local).crypt)->iv_len != 0) {
        sVar25 = 0;
        do {
          iVar7 = _libssh2_sha512_init(&hash);
          if (((iVar7 == 0) ||
              (iVar7 = _libssh2_sha512_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar7 == 0)) ||
             (iVar7 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40), iVar7 == 0))
          goto LAB_0010b54c;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar7 = _libssh2_sha512_update(&hash,"A",1);
            if (iVar7 == 0) goto LAB_0010b54c;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar7 = _libssh2_sha512_update(&hash,puVar16,uVar20);
          if ((iVar7 == 0) || (iVar7 = _libssh2_sha512_final(&hash,puVar15 + sVar25), iVar7 == 0))
          goto LAB_0010b54c;
          sVar25 = sVar25 + 0x40;
        } while (sVar25 < (ulong)(long)((session->local).crypt)->iv_len);
      }
    }
    else if (local_8c == LIBSSH2_EC_CURVE_NISTP384) {
      puVar15 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x30,&session->abstract);
      if (puVar15 == (uchar *)0x0) goto LAB_0010b555;
      if (((session->local).crypt)->iv_len != 0) {
        sVar25 = 0;
        do {
          iVar7 = _libssh2_sha384_init(&hash);
          if (((iVar7 == 0) ||
              (iVar7 = _libssh2_sha384_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar7 == 0)) ||
             (iVar7 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30), iVar7 == 0))
          goto LAB_0010b54c;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar7 = _libssh2_sha384_update(&hash,"A",1);
            if (iVar7 == 0) goto LAB_0010b54c;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar7 = _libssh2_sha384_update(&hash,puVar16,uVar20);
          if ((iVar7 == 0) || (iVar7 = _libssh2_sha384_final(&hash,puVar15 + sVar25), iVar7 == 0))
          goto LAB_0010b54c;
          sVar25 = sVar25 + 0x30;
        } while (sVar25 < (ulong)(long)((session->local).crypt)->iv_len);
      }
    }
    else {
      puVar15 = (uchar *)0x0;
    }
    if (puVar15 == (uchar *)0x0) {
      iVar7 = -1;
      bVar6 = false;
    }
    else {
      if (local_8c == LIBSSH2_EC_CURVE_NISTP256) {
        puVar16 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len + 0x20,
                                             &session->abstract);
        if (puVar16 == (uchar *)0x0) goto LAB_0010b8a8;
        if (((session->local).crypt)->secret_len != 0) {
          sVar25 = 0;
          do {
            iVar7 = _libssh2_sha256_init(&hash);
            if (((iVar7 == 0) ||
                (iVar7 = _libssh2_sha256_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar7 == 0)) ||
               (iVar7 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar7 == 0))
            goto LAB_0010b89f;
            uVar20 = sVar25;
            puVar21 = puVar16;
            if (sVar25 == 0) {
              iVar7 = _libssh2_sha256_update(&hash,"C",1);
              if (iVar7 == 0) goto LAB_0010b89f;
              uVar20 = (ulong)session->session_id_len;
              puVar21 = session->session_id;
            }
            iVar7 = _libssh2_sha256_update(&hash,puVar21,uVar20);
            if ((iVar7 == 0) || (iVar7 = _libssh2_sha256_final(&hash,puVar16 + sVar25), iVar7 == 0))
            goto LAB_0010b89f;
            sVar25 = sVar25 + 0x20;
          } while (sVar25 < (ulong)(long)((session->local).crypt)->secret_len);
        }
      }
      else if (local_8c == LIBSSH2_EC_CURVE_NISTP521) {
        puVar16 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len + 0x40,
                                             &session->abstract);
        if (puVar16 == (uchar *)0x0) goto LAB_0010b8a8;
        if (((session->local).crypt)->secret_len != 0) {
          sVar25 = 0;
          do {
            iVar7 = _libssh2_sha512_init(&hash);
            if (((iVar7 == 0) ||
                (iVar7 = _libssh2_sha512_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar7 == 0)) ||
               (iVar7 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40), iVar7 == 0))
            goto LAB_0010b89f;
            uVar20 = sVar25;
            puVar21 = puVar16;
            if (sVar25 == 0) {
              iVar7 = _libssh2_sha512_update(&hash,"C",1);
              if (iVar7 == 0) goto LAB_0010b89f;
              uVar20 = (ulong)session->session_id_len;
              puVar21 = session->session_id;
            }
            iVar7 = _libssh2_sha512_update(&hash,puVar21,uVar20);
            if ((iVar7 == 0) || (iVar7 = _libssh2_sha512_final(&hash,puVar16 + sVar25), iVar7 == 0))
            goto LAB_0010b89f;
            sVar25 = sVar25 + 0x40;
          } while (sVar25 < (ulong)(long)((session->local).crypt)->secret_len);
        }
      }
      else if ((local_8c == LIBSSH2_EC_CURVE_NISTP384) &&
              (puVar16 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                    0x30,&session->abstract),
              puVar16 != (uchar *)0x0)) {
        if (((session->local).crypt)->secret_len != 0) {
          sVar25 = 0;
          do {
            iVar7 = _libssh2_sha384_init(&hash);
            if (((iVar7 == 0) ||
                (iVar7 = _libssh2_sha384_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar7 == 0)) ||
               (iVar7 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30), iVar7 == 0))
            goto LAB_0010b89f;
            uVar20 = sVar25;
            puVar21 = puVar16;
            if (sVar25 == 0) {
              iVar7 = _libssh2_sha384_update(&hash,"C",1);
              if (iVar7 == 0) goto LAB_0010b89f;
              uVar20 = (ulong)session->session_id_len;
              puVar21 = session->session_id;
            }
            iVar7 = _libssh2_sha384_update(&hash,puVar21,uVar20);
            if ((iVar7 == 0) || (iVar7 = _libssh2_sha384_final(&hash,puVar16 + sVar25), iVar7 == 0))
            goto LAB_0010b89f;
            sVar25 = sVar25 + 0x30;
          } while (sVar25 < (ulong)(long)((session->local).crypt)->secret_len);
        }
      }
      else {
LAB_0010b8a8:
        puVar16 = (uchar *)0x0;
      }
      iVar7 = -5;
      if (puVar16 == (uchar *)0x0) {
        bVar6 = false;
      }
      else {
        pLVar2 = (session->local).crypt;
        iVar8 = (*pLVar2->init)(session,pLVar2,puVar15,(int *)&server_public_key,puVar16,
                                (int *)&server_public_key_len,1,&(session->local).crypt_abstract);
        if (iVar8 == 0) {
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar15,(long)((session->local).crypt)->iv_len);
            (*session->free)(puVar15,&session->abstract);
          }
          if ((uint32_t)server_public_key_len == 0) {
            bVar6 = true;
            iVar7 = (int)local_68;
            goto LAB_0010b94e;
          }
          explicit_bzero(puVar16,(long)((session->local).crypt)->secret_len);
          bVar6 = true;
          puVar15 = puVar16;
          iVar7 = (int)local_68;
        }
        else {
          (*session->free)(puVar15,&session->abstract);
          bVar6 = false;
          puVar15 = puVar16;
        }
      }
      (*session->free)(puVar15,&session->abstract);
    }
LAB_0010b94e:
    iVar8 = iVar7;
    if (!bVar6) goto LAB_0010b067;
  }
  p_Var1 = ((session->remote).crypt)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->remote).crypt_abstract);
  }
  pLVar2 = (session->remote).crypt;
  if (pLVar2->init !=
      (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
       *)0x0) {
    local_68 = (void **)CONCAT44(local_68._4_4_,iVar7);
    server_public_key._0_4_ = 0;
    server_public_key_len._0_4_ = 0;
    if (local_8c == LIBSSH2_EC_CURVE_NISTP256) {
      puVar15 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x20,&session->abstract);
      if (puVar15 == (uchar *)0x0) {
LAB_0010bcc6:
        puVar15 = (uchar *)0x0;
      }
      else if (((session->remote).crypt)->iv_len != 0) {
        sVar25 = 0;
        do {
          iVar7 = _libssh2_sha256_init(&hash);
          if (((iVar7 == 0) ||
              (iVar7 = _libssh2_sha256_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar7 == 0)) ||
             (iVar7 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar7 == 0))
          goto LAB_0010bcbd;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar7 = _libssh2_sha256_update(&hash,"B",1);
            if (iVar7 == 0) goto LAB_0010bcbd;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar7 = _libssh2_sha256_update(&hash,puVar16,uVar20);
          if ((iVar7 == 0) || (iVar7 = _libssh2_sha256_final(&hash,puVar15 + sVar25), iVar7 == 0))
          goto LAB_0010bcbd;
          sVar25 = sVar25 + 0x20;
        } while (sVar25 < (ulong)(long)((session->remote).crypt)->iv_len);
      }
    }
    else if (local_8c == LIBSSH2_EC_CURVE_NISTP521) {
      puVar15 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x40,&session->abstract);
      if (puVar15 == (uchar *)0x0) goto LAB_0010bcc6;
      if (((session->remote).crypt)->iv_len != 0) {
        sVar25 = 0;
        do {
          iVar7 = _libssh2_sha512_init(&hash);
          if (((iVar7 == 0) ||
              (iVar7 = _libssh2_sha512_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar7 == 0)) ||
             (iVar7 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40), iVar7 == 0))
          goto LAB_0010bcbd;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar7 = _libssh2_sha512_update(&hash,"B",1);
            if (iVar7 == 0) goto LAB_0010bcbd;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar7 = _libssh2_sha512_update(&hash,puVar16,uVar20);
          if ((iVar7 == 0) || (iVar7 = _libssh2_sha512_final(&hash,puVar15 + sVar25), iVar7 == 0))
          goto LAB_0010bcbd;
          sVar25 = sVar25 + 0x40;
        } while (sVar25 < (ulong)(long)((session->remote).crypt)->iv_len);
      }
    }
    else if (local_8c == LIBSSH2_EC_CURVE_NISTP384) {
      puVar15 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x30,&session->abstract);
      if (puVar15 == (uchar *)0x0) goto LAB_0010bcc6;
      if (((session->remote).crypt)->iv_len != 0) {
        sVar25 = 0;
        do {
          iVar7 = _libssh2_sha384_init(&hash);
          if (((iVar7 == 0) ||
              (iVar7 = _libssh2_sha384_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar7 == 0)) ||
             (iVar7 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30), iVar7 == 0))
          goto LAB_0010bcbd;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar7 = _libssh2_sha384_update(&hash,"B",1);
            if (iVar7 == 0) goto LAB_0010bcbd;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar7 = _libssh2_sha384_update(&hash,puVar16,uVar20);
          if ((iVar7 == 0) || (iVar7 = _libssh2_sha384_final(&hash,puVar15 + sVar25), iVar7 == 0))
          goto LAB_0010bcbd;
          sVar25 = sVar25 + 0x30;
        } while (sVar25 < (ulong)(long)((session->remote).crypt)->iv_len);
      }
    }
    else {
      puVar15 = (uchar *)0x0;
    }
    if (puVar15 == (uchar *)0x0) {
      iVar7 = -5;
      bVar6 = false;
    }
    else {
      if (local_8c == LIBSSH2_EC_CURVE_NISTP256) {
        puVar16 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len + 0x20,
                                             &session->abstract);
        if (puVar16 == (uchar *)0x0) goto LAB_0010c17f;
        if (((session->remote).crypt)->secret_len != 0) {
          sVar25 = 0;
          do {
            iVar7 = _libssh2_sha256_init(&hash);
            if (((iVar7 == 0) ||
                (iVar7 = _libssh2_sha256_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar7 == 0)) ||
               (iVar7 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar7 == 0))
            goto LAB_0010c176;
            uVar20 = sVar25;
            puVar21 = puVar16;
            if (sVar25 == 0) {
              iVar7 = _libssh2_sha256_update(&hash,"D",1);
              if (iVar7 == 0) goto LAB_0010c176;
              uVar20 = (ulong)session->session_id_len;
              puVar21 = session->session_id;
            }
            iVar7 = _libssh2_sha256_update(&hash,puVar21,uVar20);
            if ((iVar7 == 0) || (iVar7 = _libssh2_sha256_final(&hash,puVar16 + sVar25), iVar7 == 0))
            goto LAB_0010c176;
            sVar25 = sVar25 + 0x20;
          } while (sVar25 < (ulong)(long)((session->remote).crypt)->secret_len);
        }
      }
      else if (local_8c == LIBSSH2_EC_CURVE_NISTP521) {
        puVar16 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len + 0x40,
                                             &session->abstract);
        if (puVar16 == (uchar *)0x0) goto LAB_0010c17f;
        if (((session->remote).crypt)->secret_len != 0) {
          sVar25 = 0;
          do {
            iVar7 = _libssh2_sha512_init(&hash);
            if (((iVar7 == 0) ||
                (iVar7 = _libssh2_sha512_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar7 == 0)) ||
               (iVar7 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40), iVar7 == 0))
            goto LAB_0010c176;
            uVar20 = sVar25;
            puVar21 = puVar16;
            if (sVar25 == 0) {
              iVar7 = _libssh2_sha512_update(&hash,"D",1);
              if (iVar7 == 0) goto LAB_0010c176;
              uVar20 = (ulong)session->session_id_len;
              puVar21 = session->session_id;
            }
            iVar7 = _libssh2_sha512_update(&hash,puVar21,uVar20);
            if ((iVar7 == 0) || (iVar7 = _libssh2_sha512_final(&hash,puVar16 + sVar25), iVar7 == 0))
            goto LAB_0010c176;
            sVar25 = sVar25 + 0x40;
          } while (sVar25 < (ulong)(long)((session->remote).crypt)->secret_len);
        }
      }
      else if ((local_8c == LIBSSH2_EC_CURVE_NISTP384) &&
              (puVar16 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len +
                                                    0x30,&session->abstract),
              puVar16 != (uchar *)0x0)) {
        if (((session->remote).crypt)->secret_len != 0) {
          sVar25 = 0;
          do {
            iVar7 = _libssh2_sha384_init(&hash);
            if (((iVar7 == 0) ||
                (iVar7 = _libssh2_sha384_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar7 == 0)) ||
               (iVar7 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30), iVar7 == 0))
            goto LAB_0010c176;
            uVar20 = sVar25;
            puVar21 = puVar16;
            if (sVar25 == 0) {
              iVar7 = _libssh2_sha384_update(&hash,"D",1);
              if (iVar7 == 0) goto LAB_0010c176;
              uVar20 = (ulong)session->session_id_len;
              puVar21 = session->session_id;
            }
            iVar7 = _libssh2_sha384_update(&hash,puVar21,uVar20);
            if ((iVar7 == 0) || (iVar7 = _libssh2_sha384_final(&hash,puVar16 + sVar25), iVar7 == 0))
            goto LAB_0010c176;
            sVar25 = sVar25 + 0x30;
          } while (sVar25 < (ulong)(long)((session->remote).crypt)->secret_len);
        }
      }
      else {
LAB_0010c17f:
        puVar16 = (uchar *)0x0;
      }
      iVar7 = -5;
      if (puVar16 == (uchar *)0x0) {
        bVar6 = false;
      }
      else {
        pLVar2 = (session->remote).crypt;
        iVar8 = (*pLVar2->init)(session,pLVar2,puVar15,(int *)&server_public_key,puVar16,
                                (int *)&server_public_key_len,0,&(session->remote).crypt_abstract);
        if (iVar8 == 0) {
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar15,(long)((session->remote).crypt)->iv_len);
            (*session->free)(puVar15,&session->abstract);
          }
          if ((uint32_t)server_public_key_len == 0) {
            bVar6 = true;
            iVar7 = (int)local_68;
            goto LAB_0010c225;
          }
          explicit_bzero(puVar16,(long)((session->remote).crypt)->secret_len);
          bVar6 = true;
          puVar15 = puVar16;
          iVar7 = (int)local_68;
        }
        else {
          (*session->free)(puVar15,&session->abstract);
          bVar6 = false;
          puVar15 = puVar16;
        }
      }
      (*session->free)(puVar15,&session->abstract);
    }
LAB_0010c225:
    iVar8 = iVar7;
    if (!bVar6) goto LAB_0010b067;
  }
  p_Var1 = ((session->local).mac)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->local).mac_abstract);
  }
  p_Var3 = (session->local).mac;
  if (p_Var3->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
    server_public_key._0_4_ = 0;
    if (local_8c == LIBSSH2_EC_CURVE_NISTP521) {
      puVar15 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x40,&session->abstract);
      if (puVar15 == (uchar *)0x0) goto LAB_0010c58e;
      if (((session->local).mac)->key_len != 0) {
        sVar25 = 0;
        do {
          iVar8 = _libssh2_sha512_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha512_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40), iVar8 == 0))
          goto LAB_0010c585;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar8 = _libssh2_sha512_update(&hash,"E",1);
            if (iVar8 == 0) goto LAB_0010c585;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar8 = _libssh2_sha512_update(&hash,puVar16,uVar20);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha512_final(&hash,puVar15 + sVar25), iVar8 == 0))
          goto LAB_0010c585;
          sVar25 = sVar25 + 0x40;
        } while (sVar25 < (ulong)(long)((session->local).mac)->key_len);
      }
    }
    else if (local_8c == LIBSSH2_EC_CURVE_NISTP384) {
      puVar15 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x30,&session->abstract);
      if (puVar15 == (uchar *)0x0) goto LAB_0010c58e;
      if (((session->local).mac)->key_len != 0) {
        sVar25 = 0;
        do {
          iVar8 = _libssh2_sha384_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha384_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30), iVar8 == 0))
          goto LAB_0010c585;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar8 = _libssh2_sha384_update(&hash,"E",1);
            if (iVar8 == 0) goto LAB_0010c585;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar8 = _libssh2_sha384_update(&hash,puVar16,uVar20);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha384_final(&hash,puVar15 + sVar25), iVar8 == 0))
          goto LAB_0010c585;
          sVar25 = sVar25 + 0x30;
        } while (sVar25 < (ulong)(long)((session->local).mac)->key_len);
      }
    }
    else if ((local_8c == LIBSSH2_EC_CURVE_NISTP256) &&
            (puVar15 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x20,&session->abstract),
            puVar15 != (uchar *)0x0)) {
      if (((session->local).mac)->key_len != 0) {
        sVar25 = 0;
        do {
          iVar8 = _libssh2_sha256_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha256_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar8 == 0))
          goto LAB_0010c585;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar8 = _libssh2_sha256_update(&hash,"E",1);
            if (iVar8 == 0) goto LAB_0010c585;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar8 = _libssh2_sha256_update(&hash,puVar16,uVar20);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha256_final(&hash,puVar15 + sVar25), iVar8 == 0))
          goto LAB_0010c585;
          sVar25 = sVar25 + 0x20;
        } while (sVar25 < (ulong)(long)((session->local).mac)->key_len);
      }
    }
    else {
LAB_0010c58e:
      puVar15 = (uchar *)0x0;
    }
    if (puVar15 == (uchar *)0x0) {
      iVar7 = -5;
    }
    else {
      (*((session->local).mac)->init)
                (session,puVar15,(int *)&server_public_key,&(session->local).mac_abstract);
      if ((int)server_public_key != 0) {
        explicit_bzero(puVar15,(long)((session->local).mac)->key_len);
        (*session->free)(puVar15,&session->abstract);
      }
    }
    iVar8 = iVar7;
    if (puVar15 == (uchar *)0x0) goto LAB_0010b067;
  }
  p_Var1 = ((session->remote).mac)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->remote).mac_abstract);
  }
  p_Var3 = (session->remote).mac;
  if (p_Var3->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
    local_68 = (void **)CONCAT44(local_68._4_4_,iVar7);
    server_public_key._0_4_ = 0;
    if (local_8c == LIBSSH2_EC_CURVE_NISTP521) {
      puVar15 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x40,&session->abstract);
      if (puVar15 == (uchar *)0x0) goto LAB_0010c954;
      if (((session->remote).mac)->key_len != 0) {
        sVar25 = 0;
        do {
          iVar7 = _libssh2_sha512_init(&hash);
          if (((iVar7 == 0) ||
              (iVar7 = _libssh2_sha512_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar7 == 0)) ||
             (iVar7 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40), iVar7 == 0))
          goto LAB_0010c94b;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar7 = _libssh2_sha512_update(&hash,"F",1);
            if (iVar7 == 0) goto LAB_0010c94b;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar7 = _libssh2_sha512_update(&hash,puVar16,uVar20);
          if ((iVar7 == 0) || (iVar7 = _libssh2_sha512_final(&hash,puVar15 + sVar25), iVar7 == 0))
          goto LAB_0010c94b;
          sVar25 = sVar25 + 0x40;
        } while (sVar25 < (ulong)(long)((session->remote).mac)->key_len);
      }
    }
    else if (local_8c == LIBSSH2_EC_CURVE_NISTP384) {
      puVar15 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x30,&session->abstract);
      if (puVar15 == (uchar *)0x0) goto LAB_0010c954;
      if (((session->remote).mac)->key_len != 0) {
        sVar25 = 0;
        do {
          iVar7 = _libssh2_sha384_init(&hash);
          if (((iVar7 == 0) ||
              (iVar7 = _libssh2_sha384_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar7 == 0)) ||
             (iVar7 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30), iVar7 == 0))
          goto LAB_0010c94b;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar7 = _libssh2_sha384_update(&hash,"F",1);
            if (iVar7 == 0) goto LAB_0010c94b;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar7 = _libssh2_sha384_update(&hash,puVar16,uVar20);
          if ((iVar7 == 0) || (iVar7 = _libssh2_sha384_final(&hash,puVar15 + sVar25), iVar7 == 0))
          goto LAB_0010c94b;
          sVar25 = sVar25 + 0x30;
        } while (sVar25 < (ulong)(long)((session->remote).mac)->key_len);
      }
    }
    else if ((local_8c == LIBSSH2_EC_CURVE_NISTP256) &&
            (puVar15 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x20,&session->abstract),
            puVar15 != (uchar *)0x0)) {
      if (((session->remote).mac)->key_len != 0) {
        sVar25 = 0;
        do {
          iVar7 = _libssh2_sha256_init(&hash);
          if (((iVar7 == 0) ||
              (iVar7 = _libssh2_sha256_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar7 == 0)) ||
             (iVar7 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar7 == 0))
          goto LAB_0010c94b;
          uVar20 = sVar25;
          puVar16 = puVar15;
          if (sVar25 == 0) {
            iVar7 = _libssh2_sha256_update(&hash,"F",1);
            if (iVar7 == 0) goto LAB_0010c94b;
            uVar20 = (ulong)session->session_id_len;
            puVar16 = session->session_id;
          }
          iVar7 = _libssh2_sha256_update(&hash,puVar16,uVar20);
          if ((iVar7 == 0) || (iVar7 = _libssh2_sha256_final(&hash,puVar15 + sVar25), iVar7 == 0))
          goto LAB_0010c94b;
          sVar25 = sVar25 + 0x20;
        } while (sVar25 < (ulong)(long)((session->remote).mac)->key_len);
      }
    }
    else {
LAB_0010c954:
      puVar15 = (uchar *)0x0;
    }
    if (puVar15 == (uchar *)0x0) {
      iVar7 = -5;
    }
    else {
      (*((session->remote).mac)->init)
                (session,puVar15,(int *)&server_public_key,&(session->remote).mac_abstract);
      if ((int)server_public_key != 0) {
        explicit_bzero(puVar15,(long)((session->remote).mac)->key_len);
        (*session->free)(puVar15,&session->abstract);
      }
      iVar7 = (int)local_68;
    }
    iVar8 = iVar7;
    if (puVar15 == (uchar *)0x0) goto LAB_0010b067;
  }
  pLVar4 = (session->local).comp;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->dtor, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    (*p_Var5)(session,1,&(session->local).comp_abstract);
  }
  pLVar4 = (session->local).comp;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->init, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    iVar10 = (*p_Var5)(session,1,&(session->local).comp_abstract);
    iVar8 = -5;
    if (iVar10 != 0) goto LAB_0010b067;
  }
  pLVar4 = (session->remote).comp;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->dtor, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    (*p_Var5)(session,0,&(session->remote).comp_abstract);
  }
  pLVar4 = (session->remote).comp;
  iVar8 = iVar7;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->init, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    iVar10 = (*p_Var5)(session,0,&(session->remote).comp_abstract);
    iVar8 = -5;
    if (iVar10 == 0) {
      iVar8 = iVar7;
    }
  }
LAB_0010b067:
  BN_clear_free((BIGNUM *)exchange_state->k);
  exchange_state->k = (BIGNUM *)0x0;
  if (exchange_state->k_value != (uchar *)0x0) {
    (*session->free)(exchange_state->k_value,&session->abstract);
    exchange_state->k_value = (uchar *)0x0;
  }
  exchange_state->state = libssh2_NB_state_idle;
  return iVar8;
LAB_0010b54c:
  (*session->free)(puVar15,&session->abstract);
  goto LAB_0010b555;
LAB_0010b89f:
  (*session->free)(puVar16,&session->abstract);
  goto LAB_0010b8a8;
LAB_0010bcbd:
  (*session->free)(puVar15,&session->abstract);
  goto LAB_0010bcc6;
LAB_0010c176:
  (*session->free)(puVar16,&session->abstract);
  goto LAB_0010c17f;
LAB_0010c585:
  (*session->free)(puVar15,&session->abstract);
  goto LAB_0010c58e;
LAB_0010c94b:
  (*session->free)(puVar15,&session->abstract);
  goto LAB_0010c954;
}

Assistant:

static int ecdh_sha2_nistp(LIBSSH2_SESSION *session, libssh2_curve_type type,
                           unsigned char *data, size_t data_len,
                           unsigned char *public_key,
                           size_t public_key_len, _libssh2_ec_key *private_key,
                           kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;

    if(data_len < 5) {
        ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                             "Host key data is too short");
        return ret;
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */

        /* host key K_S */
        unsigned char *server_public_key;
        size_t server_public_key_len;
        struct string_buf buf;

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* Advance past packet type */

        if(_libssh2_copy_string(session, &buf, &(session->server_hostkey),
                                &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host ECDH key");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)server_public_key_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx) &&
               libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                  session->server_hostkey_len) &&
               libssh2_md5_final(fingerprint_ctx,
                                 session->server_hostkey_md5)) {
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx) &&
               libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len) &&
               libssh2_sha1_final(fingerprint_ctx,
                                  session->server_hostkey_sha1)) {
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx) &&
               libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                     session->server_hostkey_len) &&
               libssh2_sha256_final(fingerprint_ctx,
                                    session->server_hostkey_sha256)) {
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "ECDH");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length ECDH");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected ECDH server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_ecdh_gen_k(&exchange_state->k, private_key,
                                 server_public_key, server_public_key_len);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create ECDH shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for ECDH K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        }
        else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        /* verify hash */

        switch(type) {
            case LIBSSH2_EC_CURVE_NISTP256:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);
                break;
            case LIBSSH2_EC_CURVE_NISTP384:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(384);
                break;
            case LIBSSH2_EC_CURVE_NISTP521:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(512);
                break;
        }

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "ECDH");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message ECDH");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS ECDH");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message ECDH"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = 0;

            if(type == LIBSSH2_EC_CURVE_NISTP256)
                digest_length = SHA256_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP384)
                digest_length = SHA384_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP521)
                digest_length = SHA512_DIGEST_LENGTH;
            else{
                ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                     "Unknown SHA digest for EC curve");
                goto clean_exit;

            }
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
             session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->local.crypt->
                                                 iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->local.crypt->
                                                 secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->remote.crypt->
                                                 iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->remote.crypt->
                                                 secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->local.mac->
                                                 key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->remote.mac->
                                                 key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;

    if(exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}